

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageProcessing.cpp
# Opt level: O0

bool loadDigitsDataset(Mat *trainData,Mat *responces,int *numRows,int *numCols,int *numImages)

{
  float fVar1;
  int iVar2;
  DIR *__dirp;
  float *pfVar3;
  int iVar4;
  int local_514;
  Mat local_510 [4];
  int k;
  Size_<int> local_4b0;
  _OutputArray local_4a8;
  _InputArray local_490;
  _OutputArray local_478;
  _OutputArray local_460;
  _InputArray local_448;
  _InputArray local_430;
  _InputArray local_418;
  undefined1 local_400 [8];
  Mat mat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  allocator<char> local_379;
  undefined1 local_378 [8];
  string digit;
  char text [257];
  char local_248 [8];
  char path [255];
  char local_13a [8];
  char pathToImages [10];
  dirent *ent;
  DIR *dir;
  int i;
  int counter;
  Mat local_110 [112];
  Size_<int> local_a0;
  Mat local_98 [96];
  int local_38;
  int local_34;
  int size;
  int num;
  int *numImages_local;
  int *numCols_local;
  int *numRows_local;
  Mat *responces_local;
  Mat *trainData_local;
  
  iVar4 = (int)numImages;
  local_34 = 0x307;
  *numImages = 0x307;
  local_38 = 0x100;
  _size = numImages;
  numImages_local = numCols;
  numCols_local = numRows;
  numRows_local = (int *)responces;
  responces_local = trainData;
  cv::Size_<int>::Size_(&local_a0,0x100,0x307);
  cv::Mat::Mat(local_98,&local_a0,5);
  cv::Mat::operator=(responces_local,local_98);
  cv::Mat::~Mat(local_98);
  cv::Size_<int>::Size_((Size_<int> *)&i,1,local_34);
  cv::Mat::Mat(local_110,(Size_<int> *)&i,5);
  cv::Mat::operator=((Mat *)numRows_local,local_110);
  cv::Mat::~Mat(local_110);
  dir._4_4_ = 0;
  for (dir._0_4_ = 0; (int)dir < 10; dir._0_4_ = (int)dir + 1) {
    builtin_strncpy(local_13a,"./digits",8);
    pathToImages[0] = '3';
    pathToImages[1] = '\0';
    sprintf(local_248,"%s/%d",local_13a);
    __dirp = opendir(local_248);
    if (__dirp != (DIR *)0x0) {
      while (pathToImages._2_8_ = readdir(__dirp), (dirent *)pathToImages._2_8_ != (dirent *)0x0) {
        iVar2 = strcmp(((dirent *)pathToImages._2_8_)->d_name,".");
        if ((iVar2 != 0) && (iVar2 = strcmp((char *)(pathToImages._2_8_ + 0x13),".."), iVar2 != 0))
        {
          sprintf(digit.field_2._M_local_buf + 8,"/%s",pathToImages._2_8_ + 0x13);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_378,digit.field_2._M_local_buf + 8,&local_379);
          std::allocator<char>::~allocator(&local_379);
          std::operator+(&local_3a0,local_248,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378);
          std::__cxx11::string::operator=((string *)local_378,(string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
          cv::imread((string *)local_400,(int)(string *)local_378);
          cv::_InputArray::_InputArray(&local_418,(Mat *)local_400);
          cv::_OutputArray::_OutputArray((_OutputArray *)&local_430,(Mat *)local_400);
          cv::cvtColor((cv *)&local_418,&local_430,(_OutputArray *)0x7,0,iVar4);
          cv::_OutputArray::~_OutputArray((_OutputArray *)&local_430);
          cv::_InputArray::~_InputArray(&local_418);
          cv::_InputArray::_InputArray(&local_448,(Mat *)local_400);
          cv::_OutputArray::_OutputArray(&local_460,(Mat *)local_400);
          cv::threshold(&local_448,&local_460,200.0,255.0,8);
          cv::_OutputArray::~_OutputArray(&local_460);
          cv::_InputArray::~_InputArray(&local_448);
          cv::_OutputArray::_OutputArray(&local_478,(Mat *)local_400);
          cv::Mat::convertTo((_OutputArray *)local_400,(int)&local_478,0.00392156862745098,0.0);
          cv::_OutputArray::~_OutputArray(&local_478);
          *numCols_local = 0x10;
          *numImages_local = 0x10;
          cv::_InputArray::_InputArray(&local_490,(Mat *)local_400);
          cv::_OutputArray::_OutputArray(&local_4a8,(Mat *)local_400);
          cv::Size_<int>::Size_(&local_4b0,*numCols_local,*numImages_local);
          cv::resize(0,&local_490,&local_4a8,&local_4b0,0);
          cv::_OutputArray::~_OutputArray(&local_4a8);
          cv::_InputArray::~_InputArray(&local_490);
          cv::Mat::reshape((int)local_510,(int)local_400);
          cv::Mat::~Mat(local_510);
          for (local_514 = 0; local_514 < local_38; local_514 = local_514 + 1) {
            pfVar3 = cv::Mat::at<float>((Mat *)local_400,local_514);
            fVar1 = *pfVar3;
            pfVar3 = cv::Mat::at<float>(responces_local,dir._4_4_ * local_38 + local_514);
            *pfVar3 = fVar1;
          }
          pfVar3 = cv::Mat::at<float>((Mat *)numRows_local,dir._4_4_);
          *pfVar3 = (float)(int)dir;
          dir._4_4_ = dir._4_4_ + 1;
          cv::Mat::~Mat((Mat *)local_400);
          std::__cxx11::string::~string((string *)local_378);
        }
      }
    }
    closedir(__dirp);
  }
  return true;
}

Assistant:

bool loadDigitsDataset(Mat &trainData, Mat &responces, int &numRows, int &numCols, int &numImages){
    int num = 775;
    numImages = num;
    int size = 16 * 16;
    trainData = Mat(Size(size, num), CV_32FC1);
    responces = Mat(Size(1, num), CV_32FC1);
    int counter = 0;
    for(int i=0;i<=9;i++){
        // reading the images from the folder of tarining samples
        DIR *dir;
        struct dirent *ent;
        char pathToImages[]="./digits3"; // name of the folder containing images
        char path[255];
        sprintf(path, "%s/%d", pathToImages, i);
        if ((dir = opendir(path)) != NULL){
            while ((ent = readdir (dir)) != NULL){
                if (strcmp(ent->d_name, ".") != 0 && strcmp(ent->d_name, "..") != 0 ){
                    char text[257];
                    sprintf(text,"/%s",ent->d_name);
                    string digit(text);
                    digit=path+digit;
                    Mat mat=imread(digit,1); //loading the image
                    cvtColor(mat,mat, COLOR_RGB2GRAY);  //converting into grayscale
                    threshold(mat , mat , 200, 255 ,THRESH_OTSU); // preprocessing
                    mat.convertTo(mat,CV_32FC1,1.0/255.0); //necessary to convert images to CV_32FC1 for using K nearest neighbour algorithm
                    numRows = 16;
                    numCols = 16;
                    resize(mat, mat, Size(numRows, numCols ),0,0,INTER_NEAREST); // same size as our testing samples
                    //cout << "number " << i << endl;
                    //imshow("mat", mat);
                    //waitKey(0);
                    //cout << "M = " << endl << " " << mat << endl << endl;
                    mat.reshape(1,1);
                    for (int k=0; k<size;k++) {
                        trainData.at<float>(counter*size+k) = mat.at<float>(k); // storing the pixels of the image
                          
                        //trainData.at<float>(i ,counter*numCols+k) = mat.at<float>(k);
                    }

                    responces.at<float>(counter) = i; // stroing the responce corresponding to image
                    counter++;
                }
            }
        }
        closedir(dir);
    }
    return true;
}